

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

string * SSTable::get(string *__return_storage_ptr__,string *fileName,uint64_t key)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  runtime_error *this;
  long *plVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  string *psVar7;
  int _offset;
  uint64_t length;
  uint64_t _key;
  ifstream in;
  int local_284;
  string *local_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"readDic: Open file ",fileName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278 = (long *)*plVar6;
    plVar3 = plVar6 + 2;
    if (local_278 == plVar3) {
      local_268 = *plVar3;
      lStack_260 = plVar6[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar3;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar3;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(this,(string *)&local_278);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg((long)local_238,8);
  std::istream::read((char *)local_238,(long)&local_278);
  std::istream::seekg((long)local_238,0x2820);
  local_280 = __return_storage_ptr__;
  if (local_278 == (long *)0x0) {
    iVar4 = -1;
    iVar5 = -1;
  }
  else {
    iVar5 = -1;
    plVar6 = (long *)0x0;
    iVar4 = -1;
    do {
      std::istream::read((char *)local_238,(long)&local_258);
      std::istream::read((char *)local_238,(long)&local_284);
      iVar1 = local_284;
      if (local_258._M_dataplus._M_p == (pointer)key) {
        std::istream::read((char *)local_238,(long)&local_258);
        std::istream::read((char *)local_238,(long)&local_284);
        iVar5 = local_284 - iVar1;
        iVar4 = iVar1;
        break;
      }
      plVar6 = (long *)((long)plVar6 + 1);
    } while (plVar6 < local_278);
  }
  psVar7 = local_280;
  if (iVar4 < 0) {
    (local_280->_M_dataplus)._M_p = (pointer)&local_280->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"");
  }
  else {
    std::istream::seekg((long)local_238,iVar4 + (int)local_278 * 0xc + 0x282c);
    __s = (char *)operator_new__((long)(iVar5 + 1));
    std::istream::read((char *)local_238,(long)__s);
    psVar7 = local_280;
    __s[iVar5] = '\0';
    (local_280->_M_dataplus)._M_p = (pointer)&local_280->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar7,__s,__s + sVar2);
    operator_delete__(__s);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_238);
  return psVar7;
}

Assistant:

string SSTable::get(const string &fileName, uint64_t key) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  in.seekg(8, ifstream::beg);  // skip timeStamp
  uint64_t length;
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  int offset = -1;
  int valueSize = -1;
  for (uint64_t i = 0; i < length; i++) {
    uint64_t _key;
    int _offset;
    read64(in, _key);
    read32(in, _offset);
    if (_key == key) {
      offset = _offset;
      read64(in, _key);
      read32(in, _offset);
      valueSize = _offset - offset;
      break;
    }
  }
  if (offset < 0) return "";
  in.seekg(10272 + (length + 1) * 12 + offset, ifstream::beg);
  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}